

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.hpp
# Opt level: O2

bool __thiscall
clask::server_t::match
          (server_t *this,string *method,string *s,
          function<void_(const_clask::_func_t_&,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
          *fn)

{
  bool bVar1;
  __type _Var2;
  long lVar3;
  _node *p_Var4;
  _node *p_Var5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  string ss;
  string sub;
  node n;
  _node local_d0;
  
  bVar1 = std::operator==(method,"GET");
  p_Var5 = &this->treeGET;
  if (!bVar1) {
    p_Var5 = &this->treePOST;
  }
  _node::_node(&n,p_Var5);
  args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&ss,(string *)s);
  sub._M_dataplus._M_p = (pointer)&sub.field_2;
  sub._M_string_length = 0;
  sub.field_2._M_local_buf[0] = '\0';
  do {
    lVar3 = std::__cxx11::string::find((char)&ss,0x2f);
    if (lVar3 == -1) {
      std::__cxx11::string::substr((ulong)&local_d0,(ulong)&ss);
      std::__cxx11::string::operator=((string *)&sub,(string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      p_Var4 = n.children.super__Vector_base<clask::_node,_std::allocator<clask::_node>_>._M_impl.
               super__Vector_impl_data._M_start;
      p_Var5 = n.children.super__Vector_base<clask::_node,_std::allocator<clask::_node>_>._M_impl.
               super__Vector_impl_data._M_finish;
    }
    else {
      std::__cxx11::string::substr((ulong)&local_d0,(ulong)&ss);
      std::__cxx11::string::operator=((string *)&sub,(string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      p_Var4 = n.children.super__Vector_base<clask::_node,_std::allocator<clask::_node>_>._M_impl.
               super__Vector_impl_data._M_start;
      p_Var5 = n.children.super__Vector_base<clask::_node,_std::allocator<clask::_node>_>._M_impl.
               super__Vector_impl_data._M_finish;
    }
    while( true ) {
      if (p_Var4 == p_Var5) goto LAB_0010cfe2;
      if (p_Var4->placeholder == true) {
        url_decode((string *)&local_d0,&sub);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&args,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d0);
        std::__cxx11::string::~string((string *)&local_d0);
        _node::_node(&local_d0,p_Var4);
        goto LAB_0010cf7c;
      }
      if (((p_Var4->name)._M_string_length == 0) ||
         (_Var2 = std::operator==(&p_Var4->name,&sub), _Var2)) break;
      p_Var4 = p_Var4 + 1;
    }
    _node::_node(&local_d0,p_Var4);
LAB_0010cf7c:
    _node::operator=(&n,&local_d0);
    _node::~_node(&local_d0);
    std::__cxx11::string::substr((ulong)&local_d0,(ulong)&ss);
    std::__cxx11::string::operator=((string *)&ss,(string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
  } while ((ss._M_string_length != 0) &&
          (n.children.super__Vector_base<clask::_node,_std::allocator<clask::_node>_>._M_impl.
           super__Vector_impl_data._M_start !=
           n.children.super__Vector_base<clask::_node,_std::allocator<clask::_node>_>._M_impl.
           super__Vector_impl_data._M_finish));
  std::
  function<void_(const_clask::_func_t_&,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
  ::operator()(fn,&n.fn,&args);
LAB_0010cfe2:
  std::__cxx11::string::~string((string *)&sub);
  std::__cxx11::string::~string((string *)&ss);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&args);
  _node::~_node(&n);
  return p_Var4 != p_Var5;
}

Assistant:

inline bool server_t::match(const std::string& method, const std::string& s, const std::function<void(const func_t& fn, const std::vector<std::string>&)>& fn) const {
  node n = method == "GET" ? treeGET : treePOST;
  std::vector<std::string> args;
  auto ss = s;
  std::string sub;
  while (true) {
    auto pos = ss.find('/', 1);

    if (pos == std::string::npos) {
      sub = ss.substr(1);
      pos = ss.size();
    } else {
      sub = ss.substr(1, pos - 1);
    }
    bool found = false;
    for (const auto& vv : n.children) {
      if (vv.placeholder) {
        args.emplace_back(url_decode(sub));
        n = node(vv);
        found = true;
        break;
      } else if (vv.name.empty() || vv.name == sub) {
        n = node(vv);
        found = true;
        break;
      }
    }
    if (!found)
      break;
    ss = ss.substr(pos);
    if (ss.empty() || n.children.empty()) {
      fn(n.fn, args);
      return true;
    }
  }
  return false;
}